

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetshortcut.cpp
# Opt level: O3

int __thiscall
ncnn::DarknetShortcut::forward
          (DarknetShortcut *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pMVar7;
  Mat *pMVar8;
  int *piVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  void *pvVar22;
  ulong uVar23;
  float *pfVar24;
  int iVar25;
  ulong local_b0;
  long local_a8;
  Mat local_70;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = pMVar7->w;
  iVar4 = pMVar7->h;
  iVar5 = pMVar7[1].w;
  iVar6 = pMVar7[1].h;
  uVar23 = (long)iVar3 / (long)iVar5 & 0xffffffff;
  uVar19 = iVar5 / iVar3;
  iVar18 = -1;
  iVar25 = (int)((long)iVar3 / (long)iVar5);
  if ((iVar25 == iVar4 / iVar6) && (uVar19 == iVar6 / iVar4)) {
    if (iVar25 < 2) {
      uVar23 = 1;
    }
    uVar17 = 1;
    if (1 < (int)uVar19) {
      uVar17 = uVar19;
    }
    if (iVar3 < iVar5) {
      iVar5 = iVar3;
    }
    if (iVar4 < iVar6) {
      iVar6 = iVar4;
    }
    uVar19 = pMVar7[1].c;
    if (pMVar7->c < pMVar7[1].c) {
      uVar19 = pMVar7->c;
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::clone(&local_70,(__fn *)(pMVar7 + 1),(void *)0x0,(int)top_blobs,(void *)0xffffffff);
    if (pMVar8 != &local_70) {
      if (local_70.refcount != (int *)0x0) {
        LOCK();
        *local_70.refcount = *local_70.refcount + 1;
        UNLOCK();
      }
      piVar9 = pMVar8->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (pMVar8->allocator == (Allocator *)0x0) {
            if (pMVar8->data != (void *)0x0) {
              free(pMVar8->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar8->allocator + 0x18))();
          }
        }
      }
      pMVar8->data = local_70.data;
      pMVar8->refcount = local_70.refcount;
      pMVar8->elemsize = local_70.elemsize;
      pMVar8->elempack = local_70.elempack;
      pMVar8->allocator = local_70.allocator;
      pMVar8->dims = local_70.dims;
      pMVar8->w = local_70.w;
      pMVar8->h = local_70.h;
      pMVar8->c = local_70.c;
      pMVar8->cstep = local_70.cstep;
    }
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + -1;
      UNLOCK();
      if (*local_70.refcount == 0) {
        if (local_70.allocator == (Allocator *)0x0) {
          if (local_70.data != (void *)0x0) {
            free(local_70.data);
          }
        }
        else {
          (**(code **)(*(long *)local_70.allocator + 0x18))();
        }
      }
    }
    iVar18 = -100;
    if ((pMVar8->data != (void *)0x0) && (sVar10 = pMVar8->cstep, (long)pMVar8->c * sVar10 != 0)) {
      if (0 < (int)uVar19) {
        uVar14 = (ulong)uVar17;
        local_a8 = 0;
        local_b0 = 0;
        do {
          if (0 < iVar6) {
            iVar3 = pMVar7->w;
            iVar4 = pMVar7[1].w;
            sVar11 = pMVar7->elemsize;
            sVar12 = pMVar7[1].elemsize;
            sVar13 = pMVar8->elemsize;
            pvVar15 = (void *)(sVar13 * local_a8 + (long)pMVar8->data);
            iVar18 = pMVar8->w;
            pvVar22 = (void *)(sVar12 * pMVar7[1].cstep * local_b0 + (long)pMVar7[1].data);
            pfVar24 = (float *)(sVar11 * pMVar7->cstep * local_b0 + (long)pMVar7->data);
            iVar25 = 0;
            do {
              if (0 < iVar5) {
                lVar20 = 0;
                pfVar21 = pfVar24;
                iVar16 = iVar5;
                do {
                  uVar1 = this->alpha;
                  uVar2 = this->beta;
                  *(float *)((long)pvVar15 + lVar20) =
                       *pfVar21 * (float)uVar2 + *(float *)((long)pvVar22 + lVar20) * (float)uVar1;
                  lVar20 = lVar20 + uVar14 * 4;
                  pfVar21 = pfVar21 + uVar23;
                  iVar16 = iVar16 + -1;
                } while (iVar16 != 0);
              }
              iVar25 = iVar25 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar13 * uVar14 * (long)iVar18);
              pvVar22 = (void *)((long)pvVar22 + uVar14 * sVar12 * (long)iVar4);
              pfVar24 = (float *)((long)pfVar24 + uVar23 * sVar11 * (long)iVar3);
            } while (iVar25 != iVar6);
          }
          local_b0 = local_b0 + 1;
          local_a8 = local_a8 + sVar10;
        } while (local_b0 != uVar19);
      }
      iVar18 = 0;
    }
  }
  return iVar18;
}

Assistant:

int DarknetShortcut::forward(const std::vector<Mat> &bottom_blobs,
                             std::vector<Mat> &top_blobs,
                             const Option &opt) const
{
  const Mat &bottom_blob = bottom_blobs[0];
  int w = bottom_blob.w;
  int h = bottom_blob.h;
  int c = bottom_blob.c;

  const Mat &bottom_blob1 = bottom_blobs[1];
  int o_w = bottom_blob1.w;
  int o_h = bottom_blob1.h;
  int o_c = bottom_blob1.c;

  int i_stride = w / o_w;
  int o_stride = o_w / w;
  if (i_stride != h / o_h) return -1;
  if (o_stride != o_h / h) return -1;
  i_stride = i_stride < 1 ? 1 : i_stride;
  o_stride = o_stride < 1 ? 1 : o_stride;

  int op_w = w < o_w ? w : o_w;
  int op_h = h < o_h ? h : o_h;
  int op_c = c < o_c ? c : o_c;

  Mat &top_blob = top_blobs[0];
  size_t elemsize = bottom_blob.elemsize;
  top_blob = bottom_blob1.clone();
  if (top_blob.empty())
    return -100;

  #pragma omp parallel for num_threads(opt.num_threads)
  for (int q = 0; q < op_c; q++)
  {

    int out_offset_h = 0;
    int in_offset_h = 0;

    for (int hi = 0; hi < op_h; hi++)
    {

      const float *ptr1 = bottom_blob.channel(q).row(in_offset_h);
      const float *ptr2 = bottom_blob1.channel(q).row(out_offset_h);
      float *outptr = top_blob.channel(q).row(out_offset_h);

      out_offset_h += o_stride;
      in_offset_h += i_stride;

      for (int i = 0; i < op_w; i++)
      {
        *outptr = alpha * (*ptr2) + beta * (*ptr1);

        ptr2 += o_stride;
        ptr1 += i_stride;
        outptr += o_stride;
      }
    }
  }

  return 0;
}